

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

CK_OBJECT_HANDLE __thiscall HandleManager::getObjectHandle(HandleManager *this,CK_VOID_PTR object)

{
  bool bVar1;
  pointer ppVar2;
  MutexLocker *in_RDI;
  iterator it;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff98;
  _Self local_48 [3];
  _Self local_30 [5];
  unsigned_long local_8;
  
  MutexLocker::MutexLocker(in_RDI,in_stack_ffffffffffffff98);
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
       ::find((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
               *)in_stack_ffffffffffffff98,(key_type *)0x1cc9b9);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
       ::end((map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
              *)in_stack_ffffffffffffff98);
  bVar1 = std::operator==(local_30,local_48);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<void_*const,_unsigned_long>_> *)0x1cca29);
    local_8 = ppVar2->second;
  }
  MutexLocker::~MutexLocker(in_RDI);
  return local_8;
}

Assistant:

CK_OBJECT_HANDLE HandleManager::getObjectHandle(CK_VOID_PTR object)
{
	MutexLocker lock(handlesMutex);

	std::map< CK_VOID_PTR, CK_ULONG>::iterator it = objects.find(object);
	if (it == objects.end())
		return CK_INVALID_HANDLE;
	return it->second;
}